

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.h
# Opt level: O0

void __thiscall
SQCompilation::Node::visit<SQCompilation::ClosureHoistingOpt::HoistingVisitor>
          (Node *this,HoistingVisitor *visitor)

{
  TreeOp TVar1;
  long *in_RSI;
  Node *in_RDI;
  
  TVar1 = op(in_RDI);
  switch(TVar1) {
  case TO_BLOCK:
    (**(code **)(*in_RSI + 0xb8))(in_RSI,in_RDI);
    break;
  case TO_IF:
    (**(code **)(*in_RSI + 0xc0))(in_RSI,in_RDI);
    break;
  case TO_WHILE:
    (**(code **)(*in_RSI + 0xd0))(in_RSI,in_RDI);
    break;
  case TO_DOWHILE:
    (**(code **)(*in_RSI + 0xd8))(in_RSI,in_RDI);
    break;
  case TO_FOR:
    (**(code **)(*in_RSI + 0xe0))(in_RSI,in_RDI);
    break;
  case TO_FOREACH:
    (**(code **)(*in_RSI + 0xe8))(in_RSI,in_RDI);
    break;
  case TO_SWITCH:
    (**(code **)(*in_RSI + 0xf0))(in_RSI,in_RDI);
    break;
  case TO_RETURN:
    (**(code **)(*in_RSI + 0x108))(in_RSI,in_RDI);
    break;
  case TO_YIELD:
    (**(code **)(*in_RSI + 0x110))(in_RSI,in_RDI);
    break;
  case TO_THROW:
    (**(code **)(*in_RSI + 0x118))(in_RSI,in_RDI);
    break;
  case TO_TRY:
    (**(code **)(*in_RSI + 0xf8))(in_RSI,in_RDI);
    break;
  case TO_BREAK:
    (**(code **)(*in_RSI + 0x128))(in_RSI,in_RDI);
    break;
  case TO_CONTINUE:
    (**(code **)(*in_RSI + 0x130))(in_RSI,in_RDI);
    break;
  case TO_EXPR_STMT:
    (**(code **)(*in_RSI + 0x138))(in_RSI,in_RDI);
    break;
  case TO_EMPTY:
    (**(code **)(*in_RSI + 0x140))(in_RSI,in_RDI);
    break;
  case TO_DIRECTIVE:
    (**(code **)(*in_RSI + 0x1a8))(in_RSI,in_RDI);
    break;
  default:
    break;
  case TO_ID:
    (**(code **)(*in_RSI + 0x40))(in_RSI,in_RDI);
    break;
  case TO_COMMA:
    (**(code **)(*in_RSI + 0xa0))(in_RSI,in_RDI);
    break;
  case TO_NULLC:
  case TO_ASSIGN:
  case TO_OROR:
  case TO_ANDAND:
  case TO_OR:
  case TO_XOR:
  case TO_AND:
  case TO_NE:
  case TO_EQ:
  case TO_3CMP:
  case TO_GE:
  case TO_GT:
  case TO_LE:
  case TO_LT:
  case TO_IN:
  case TO_INSTANCEOF:
  case TO_USHR:
  case TO_SHR:
  case TO_SHL:
  case TO_MUL:
  case TO_DIV:
  case TO_MOD:
  case TO_ADD:
  case TO_SUB:
  case TO_NEWSLOT:
  case TO_PLUSEQ:
  case TO_MINUSEQ:
  case TO_MULEQ:
  case TO_DIVEQ:
  case TO_MODEQ:
    (**(code **)(*in_RSI + 0x28))(in_RSI,in_RDI);
    break;
  case TO_NOT:
  case TO_BNOT:
  case TO_NEG:
  case TO_TYPEOF:
  case TO_RESUME:
  case TO_CLONE:
  case TO_PAREN:
  case TO_DELETE:
    (**(code **)(*in_RSI + 0x20))(in_RSI,in_RDI);
    break;
  case TO_LITERAL:
    (**(code **)(*in_RSI + 0x80))(in_RSI,in_RDI);
    break;
  case TO_BASE:
    (**(code **)(*in_RSI + 0x70))(in_RSI,in_RDI);
    break;
  case TO_ROOT_TABLE_ACCESS:
    (**(code **)(*in_RSI + 0x78))(in_RSI,in_RDI);
    break;
  case TO_INC:
    (**(code **)(*in_RSI + 0x88))(in_RSI,in_RDI);
    break;
  case TO_DECL_EXPR:
    (**(code **)(*in_RSI + 0x90))(in_RSI,in_RDI);
    break;
  case TO_ARRAYEXPR:
    (**(code **)(*in_RSI + 0x98))(in_RSI,in_RDI);
    break;
  case TO_GETFIELD:
    (**(code **)(*in_RSI + 0x50))(in_RSI,in_RDI);
    break;
  case TO_SETFIELD:
    (**(code **)(*in_RSI + 0x58))(in_RSI,in_RDI);
    break;
  case TO_GETSLOT:
    (**(code **)(*in_RSI + 0x60))(in_RSI,in_RDI);
    break;
  case TO_SETSLOT:
    (**(code **)(*in_RSI + 0x68))(in_RSI,in_RDI);
    break;
  case TO_CALL:
    (**(code **)(*in_RSI + 0x38))(in_RSI,in_RDI);
    break;
  case TO_TERNARY:
    (**(code **)(*in_RSI + 0x30))(in_RSI,in_RDI);
    break;
  case TO_EXTERNAL_VALUE:
    (**(code **)(*in_RSI + 0xa8))(in_RSI,in_RDI);
    break;
  case TO_VAR:
    (**(code **)(*in_RSI + 0x158))(in_RSI,in_RDI);
    break;
  case TO_PARAM:
    (**(code **)(*in_RSI + 0x160))(in_RSI,in_RDI);
    break;
  case TO_CONST:
    (**(code **)(*in_RSI + 0x188))(in_RSI,in_RDI);
    break;
  case TO_DECL_GROUP:
    (**(code **)(*in_RSI + 0x198))(in_RSI,in_RDI);
    break;
  case TO_DESTRUCTURE:
    (**(code **)(*in_RSI + 0x1a0))(in_RSI,in_RDI);
    break;
  case TO_FUNCTION:
    (**(code **)(*in_RSI + 0x178))(in_RSI,in_RDI);
    break;
  case TO_CONSTRUCTOR:
    (**(code **)(*in_RSI + 0x180))(in_RSI,in_RDI);
    break;
  case TO_CLASS:
    (**(code **)(*in_RSI + 0x170))(in_RSI,in_RDI);
    break;
  case TO_ENUM:
    (**(code **)(*in_RSI + 400))(in_RSI,in_RDI);
    break;
  case TO_TABLE:
    (**(code **)(*in_RSI + 0x168))(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void Node::visit(V *visitor) {
    switch (op())
    {
    case TO_BLOCK:      visitor->visitBlock(static_cast<Block *>(this)); return;
    case TO_IF:         visitor->visitIfStatement(static_cast<IfStatement *>(this)); return;
    case TO_WHILE:      visitor->visitWhileStatement(static_cast<WhileStatement *>(this)); return;
    case TO_DOWHILE:    visitor->visitDoWhileStatement(static_cast<DoWhileStatement *>(this)); return;
    case TO_FOR:        visitor->visitForStatement(static_cast<ForStatement *>(this)); return;
    case TO_FOREACH:    visitor->visitForeachStatement(static_cast<ForeachStatement *>(this)); return;
    case TO_SWITCH:     visitor->visitSwitchStatement(static_cast<SwitchStatement *>(this)); return;
    case TO_RETURN:     visitor->visitReturnStatement(static_cast<ReturnStatement *>(this)); return;
    case TO_YIELD:      visitor->visitYieldStatement(static_cast<YieldStatement *>(this)); return;
    case TO_THROW:      visitor->visitThrowStatement(static_cast<ThrowStatement *>(this)); return;
    case TO_TRY:        visitor->visitTryStatement(static_cast<TryStatement *>(this)); return;
    case TO_BREAK:      visitor->visitBreakStatement(static_cast<BreakStatement *>(this)); return;
    case TO_CONTINUE:   visitor->visitContinueStatement(static_cast<ContinueStatement *>(this)); return;
    case TO_EXPR_STMT:  visitor->visitExprStatement(static_cast<ExprStatement *>(this)); return;
    case TO_EMPTY:      visitor->visitEmptyStatement(static_cast<EmptyStatement *>(this)); return;
        //case TO_STATEMENT_MARK:
    case TO_ID:         visitor->visitId(static_cast<Id *>(this)); return;
    case TO_COMMA:      visitor->visitCommaExpr(static_cast<CommaExpr *>(this)); return;
    case TO_NULLC:
    case TO_ASSIGN:
    case TO_OROR:
    case TO_ANDAND:
    case TO_OR:
    case TO_XOR:
    case TO_AND:
    case TO_NE:
    case TO_EQ:
    case TO_3CMP:
    case TO_GE:
    case TO_GT:
    case TO_LE:
    case TO_LT:
    case TO_IN:
    case TO_INSTANCEOF:
    case TO_USHR:
    case TO_SHR:
    case TO_SHL:
    case TO_MUL:
    case TO_DIV:
    case TO_MOD:
    case TO_ADD:
    case TO_SUB:
    case TO_NEWSLOT:
    case TO_PLUSEQ:
    case TO_MINUSEQ:
    case TO_MULEQ:
    case TO_DIVEQ:
    case TO_MODEQ:
        visitor->visitBinExpr(static_cast<BinExpr *>(this)); return;
    case TO_NOT:
    case TO_BNOT:
    case TO_NEG:
    case TO_TYPEOF:
    case TO_RESUME:
    case TO_CLONE:
    case TO_PAREN:
    case TO_DELETE:
        visitor->visitUnExpr(static_cast<UnExpr *>(this)); return;
    case TO_LITERAL:
        visitor->visitLiteralExpr(static_cast<LiteralExpr *>(this)); return;
    case TO_BASE:
        visitor->visitBaseExpr(static_cast<BaseExpr *>(this)); return;
    case TO_ROOT_TABLE_ACCESS:
        visitor->visitRootTableAccessExpr(static_cast<RootTableAccessExpr *>(this)); return;
    case TO_INC:
        visitor->visitIncExpr(static_cast<IncExpr *>(this)); return;
    case TO_DECL_EXPR:
        visitor->visitDeclExpr(static_cast<DeclExpr *>(this)); return;
    case TO_ARRAYEXPR:
        visitor->visitArrayExpr(static_cast<ArrayExpr *>(this)); return;
    case TO_GETFIELD:
        visitor->visitGetFieldExpr(static_cast<GetFieldExpr *>(this)); return;
    case TO_SETFIELD:
        visitor->visitSetFieldExpr(static_cast<SetFieldExpr *>(this)); return;
    case TO_GETSLOT:
        visitor->visitGetSlotExpr(static_cast<GetSlotExpr *>(this)); return;
    case TO_SETSLOT:
        visitor->visitSetSlotExpr(static_cast<SetSlotExpr *>(this)); return;
    case TO_CALL:
        visitor->visitCallExpr(static_cast<CallExpr *>(this)); return;
    case TO_TERNARY:
        visitor->visitTerExpr(static_cast<TerExpr *>(this)); return;
    case TO_EXTERNAL_VALUE:
        visitor->visitExternalValueExpr(static_cast<ExternalValueExpr *>(this)); return;
        //case TO_EXPR_MARK:
    case TO_VAR:
        visitor->visitVarDecl(static_cast<VarDecl *>(this)); return;
    case TO_PARAM:
        visitor->visitParamDecl(static_cast<ParamDecl *>(this)); return;
    case TO_CONST:
        visitor->visitConstDecl(static_cast<ConstDecl *>(this)); return;
    case TO_DECL_GROUP:
        visitor->visitDeclGroup(static_cast<DeclGroup *>(this)); return;
    case TO_DESTRUCTURE:
        visitor->visitDestructuringDecl(static_cast<DestructuringDecl  *>(this)); return;
    case TO_FUNCTION:
        visitor->visitFunctionDecl(static_cast<FunctionDecl *>(this)); return;
    case TO_CONSTRUCTOR:
        visitor->visitConstructorDecl(static_cast<ConstructorDecl *>(this)); return;
    case TO_CLASS:
        visitor->visitClassDecl(static_cast<ClassDecl *>(this)); return;
    case TO_ENUM:
        visitor->visitEnumDecl(static_cast<EnumDecl *>(this)); return;
    case TO_TABLE:
        visitor->visitTableDecl(static_cast<TableDecl *>(this)); return;
    case TO_DIRECTIVE:
        visitor->visitDirectiveStatement(static_cast<DirectiveStmt *>(this)); return;
    default:
        break;
    }
}